

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::ReorderingBuffer::appendZeroCC(ReorderingBuffer *this,UChar32 c,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  int appendLength;
  int32_t cpLength;
  UErrorCode *errorCode_local;
  UChar32 c_local;
  ReorderingBuffer *this_local;
  
  appendLength = 2;
  if ((uint)c < 0x10000) {
    appendLength = 1;
  }
  if ((this->remainingCapacity < appendLength) &&
     (UVar2 = resize(this,appendLength,errorCode), UVar2 == '\0')) {
    return '\0';
  }
  this->remainingCapacity = this->remainingCapacity - appendLength;
  if (appendLength == 1) {
    pUVar1 = this->limit;
    this->limit = pUVar1 + 1;
    *pUVar1 = (UChar)c;
  }
  else {
    *this->limit = (short)(c >> 10) + L'ퟀ';
    this->limit[1] = (UChar)c & 0x3ffU | 0xdc00;
    this->limit = this->limit + 2;
  }
  this->lastCC = '\0';
  this->reorderStart = this->limit;
  return '\x01';
}

Assistant:

UBool ReorderingBuffer::appendZeroCC(UChar32 c, UErrorCode &errorCode) {
    int32_t cpLength=U16_LENGTH(c);
    if(remainingCapacity<cpLength && !resize(cpLength, errorCode)) {
        return FALSE;
    }
    remainingCapacity-=cpLength;
    if(cpLength==1) {
        *limit++=(UChar)c;
    } else {
        limit[0]=U16_LEAD(c);
        limit[1]=U16_TRAIL(c);
        limit+=2;
    }
    lastCC=0;
    reorderStart=limit;
    return TRUE;
}